

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenSIMDLoadStoreLane
          (BinaryenModuleRef module,BinaryenOp op,uint32_t offset,uint32_t align,uint8_t index,
          BinaryenExpressionRef ptr,BinaryenExpressionRef vec,char *memoryName)

{
  SIMDLoadStoreLane *pSVar1;
  Address align_00;
  Address offset_00;
  Name memory;
  Builder local_38;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  align_00.addr._4_4_ = 0;
  align_00.addr._0_4_ = align;
  local_38.wasm = module;
  memory = getMemoryName(module,memoryName);
  pSVar1 = wasm::Builder::makeSIMDLoadStoreLane
                     (&local_38,op,offset_00,align_00,index,ptr,vec,memory);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDLoadStoreLane(BinaryenModuleRef module,
                                                BinaryenOp op,
                                                uint32_t offset,
                                                uint32_t align,
                                                uint8_t index,
                                                BinaryenExpressionRef ptr,
                                                BinaryenExpressionRef vec,
                                                const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDLoadStoreLane(SIMDLoadStoreLaneOp(op),
                             Address(offset),
                             Address(align),
                             index,
                             (Expression*)ptr,
                             (Expression*)vec,
                             getMemoryName(module, memoryName)));
}